

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fIntegerStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::IntegerStateQueryVerifiers::GetBooleanVerifier::verifyInteger4Mask
          (GetBooleanVerifier *this,TestContext *testCtx,GLenum name,GLint reference0,
          bool enableRef0,GLint reference1,bool enableRef1,GLint reference2,bool enableRef2,
          GLint reference3,bool enableRef3)

{
  bool bVar1;
  qpTestResult qVar2;
  uchar (*pauVar3) [4];
  TestLog *this_00;
  MessageBuilder *pMVar4;
  char *local_278;
  char *local_260;
  char *local_248;
  char *local_230;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8 [3];
  MessageBuilder local_1c0;
  uchar local_3b;
  uchar local_3a;
  uchar local_39;
  uchar local_38;
  undefined1 local_37 [4];
  GLboolean referenceAsGLBoolean [4];
  StateQueryMemoryWriteGuard<unsigned_char[4]> boolVector4;
  bool enableRef3_local;
  bool enableRef2_local;
  bool enableRef1_local;
  GLint reference1_local;
  bool enableRef0_local;
  GLint reference0_local;
  GLenum name_local;
  TestContext *testCtx_local;
  GetBooleanVerifier *this_local;
  
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_char[4]>::
  StateQueryMemoryWriteGuard((StateQueryMemoryWriteGuard<unsigned_char[4]> *)local_37);
  pauVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_function_pointer
                      ((StateQueryMemoryWriteGuard *)local_37);
  glu::CallLogWrapper::glGetBooleanv
            (&(this->super_StateVerifier).super_CallLogWrapper,name,*pauVar3);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_char[4]>::verifyValidity
                    ((StateQueryMemoryWriteGuard<unsigned_char[4]> *)local_37,testCtx);
  if (bVar1) {
    local_3b = reference0 != 0;
    local_3a = reference1 != 0;
    local_39 = reference2 != 0;
    local_38 = reference3 != 0;
    if (((((enableRef0) &&
          (pauVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                     operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_37),
          (*pauVar3)[0] != local_3b)) ||
         ((enableRef1 &&
          (pauVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                     operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_37),
          (*pauVar3)[1] != local_3a)))) ||
        ((enableRef2 &&
         (pauVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                    operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_37),
         (*pauVar3)[2] != local_39)))) ||
       ((enableRef3 &&
        (pauVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                   operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_37),
        (*pauVar3)[3] != local_38)))) {
      this_00 = tcu::TestContext::getLog(testCtx);
      tcu::TestLog::operator<<(&local_1c0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<(&local_1c0,(char (*) [20])"// ERROR: expected ");
      if (enableRef0) {
        local_230 = "GL_FALSE";
        if (local_3b != '\0') {
          local_230 = "GL_TRUE";
        }
      }
      else {
        local_230 = " - ";
      }
      local_1d8[0] = local_230;
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,local_1d8);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x12ed2ef);
      if (enableRef1) {
        local_248 = "GL_FALSE";
        if (local_3a != '\0') {
          local_248 = "GL_TRUE";
        }
      }
      else {
        local_248 = " - ";
      }
      local_1e0 = local_248;
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_1e0);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x12ed2ef);
      if (enableRef2) {
        local_260 = "GL_FALSE";
        if (local_39 != '\0') {
          local_260 = "GL_TRUE";
        }
      }
      else {
        local_260 = " - ";
      }
      local_1e8 = local_260;
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_1e8);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x12ed2ef);
      if (enableRef3) {
        local_278 = "GL_FALSE";
        if (local_38 != '\0') {
          local_278 = "GL_TRUE";
        }
      }
      else {
        local_278 = " - ";
      }
      local_1f0 = local_278;
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_1f0);
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1c0);
      qVar2 = tcu::TestContext::getTestResult(testCtx);
      if (qVar2 == QP_TEST_RESULT_PASS) {
        tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid boolean value");
      }
    }
  }
  return;
}

Assistant:

void GetBooleanVerifier::verifyInteger4Mask (tcu::TestContext& testCtx, GLenum name, GLint reference0, bool enableRef0, GLint reference1, bool enableRef1, GLint reference2, bool enableRef2, GLint reference3, bool enableRef3)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLboolean[4]> boolVector4;
	glGetBooleanv(name, boolVector4);

	if (!boolVector4.verifyValidity(testCtx))
		return;

	const GLboolean referenceAsGLBoolean[] =
	{
		reference0 ? (GLboolean)GL_TRUE : (GLboolean)GL_FALSE,
		reference1 ? (GLboolean)GL_TRUE : (GLboolean)GL_FALSE,
		reference2 ? (GLboolean)GL_TRUE : (GLboolean)GL_FALSE,
		reference3 ? (GLboolean)GL_TRUE : (GLboolean)GL_FALSE,
	};

	if ((enableRef0 && (boolVector4[0] != referenceAsGLBoolean[0])) ||
		(enableRef1 && (boolVector4[1] != referenceAsGLBoolean[1])) ||
		(enableRef2 && (boolVector4[2] != referenceAsGLBoolean[2])) ||
		(enableRef3 && (boolVector4[3] != referenceAsGLBoolean[3])))
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: expected "
			<< (enableRef0 ? (referenceAsGLBoolean[0] ? "GL_TRUE" : "GL_FALSE") : " - ") << ", "
			<< (enableRef1 ? (referenceAsGLBoolean[1] ? "GL_TRUE" : "GL_FALSE") : " - ") << ", "
			<< (enableRef2 ? (referenceAsGLBoolean[2] ? "GL_TRUE" : "GL_FALSE") : " - ") << ", "
			<< (enableRef3 ? (referenceAsGLBoolean[3] ? "GL_TRUE" : "GL_FALSE") : " - ") << TestLog::EndMessage;

		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid boolean value");
	}
}